

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestResult.cpp
# Opt level: O3

void __thiscall
oout::TestResult::TestResult(TestResult *this,shared_ptr<const_oout::Result> *result)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  (this->super_Result)._vptr_Result = (_func_int **)&PTR__TestResult_001988f0;
  (this->result).super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (result->super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (result->super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  (this->result).super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded != '\0') {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      return;
    }
    LOCK();
    p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    UNLOCK();
  }
  return;
}

Assistant:

TestResult::TestResult(const shared_ptr<const Result> &result)
	: result(result)
{
}